

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_225155::OSSPlayback::mixerProc(OSSPlayback *this)

{
  ALCdevice *this_00;
  FILE *__stream;
  bool bVar1;
  ALuint AVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  long in_RDI;
  ssize_t wrote;
  size_t to_write;
  ALubyte *write_ptr;
  int pret;
  pollfd pollitem;
  ALuint frame_size;
  size_t frame_step;
  size_t in_stack_000000b8;
  ALuint in_stack_000000c4;
  void *in_stack_000000c8;
  ALCdevice *in_stack_000000d0;
  ALCdevice *in_stack_ffffffffffffff90;
  FILE *in_stack_ffffffffffffff98;
  byte local_59;
  bool local_41;
  size_t local_30;
  uchar *local_28;
  pollfd local_1c;
  ALuint local_14;
  ulong local_10;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  AVar2 = ALCdevice::channelsFromFmt((ALCdevice *)0x2392b2);
  local_10 = (ulong)AVar2;
  local_14 = ALCdevice::frameSizeFromFmt(in_stack_ffffffffffffff90);
LAB_002392cd:
  do {
    while( true ) {
      while( true ) {
        bVar1 = std::atomic<bool>::load
                          ((atomic<bool> *)in_stack_ffffffffffffff98,
                           (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
        local_41 = false;
        if (!bVar1) {
          local_41 = std::atomic<bool>::load
                               ((atomic<bool> *)in_stack_ffffffffffffff98,
                                (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
        }
        if (local_41 == false) {
          return 0;
        }
        memset(&local_1c,0,8);
        local_1c.fd = *(int *)(in_RDI + 0x10);
        local_1c.events = 4;
        iVar3 = poll(&local_1c,1,1000);
        if (-1 < iVar3) break;
        piVar4 = __errno_location();
        if ((*piVar4 != 4) && (piVar4 = __errno_location(), __stream = gLogFile, *piVar4 != 0xb)) {
          if (0 < (int)gLogLevel) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf((FILE *)__stream,"[ALSOFT] (EE) poll failed: %s\n",pcVar5);
          }
          this_00 = *(ALCdevice **)(in_RDI + 8);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          ALCdevice::handleDisconnect(this_00,"Failed waiting for playback buffer: %s",pcVar5);
          return 0;
        }
      }
      if (iVar3 != 0) break;
      if (1 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (WW) poll timeout\n");
      }
    }
    local_28 = std::vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_>::data
                         ((vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_> *)0x239445);
    local_30 = std::vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_>::size
                         ((vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_> *)
                          (in_RDI + 0x18));
    ALCdevice::renderSamples
              (in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000b8);
    do {
      while( true ) {
        local_59 = 0;
        if (local_30 != 0) {
          bVar1 = std::atomic<bool>::load
                            ((atomic<bool> *)in_stack_ffffffffffffff98,
                             (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
          local_59 = bVar1 ^ 0xff;
        }
        if ((local_59 & 1) == 0) goto LAB_002392cd;
        sVar6 = write(*(int *)(in_RDI + 0x10),local_28,local_30);
        if (sVar6 < 0) break;
        local_30 = local_30 - sVar6;
        local_28 = local_28 + sVar6;
      }
      piVar4 = __errno_location();
    } while (((*piVar4 == 0xb) || (piVar4 = __errno_location(), *piVar4 == 0xb)) ||
            (piVar4 = __errno_location(), *piVar4 == 4));
    if (0 < (int)gLogLevel) {
      in_stack_ffffffffffffff98 = (FILE *)gLogFile;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(in_stack_ffffffffffffff98,"[ALSOFT] (EE) write failed: %s\n",pcVar5);
    }
    in_stack_ffffffffffffff90 = *(ALCdevice **)(in_RDI + 8);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    ALCdevice::handleDisconnect
              (in_stack_ffffffffffffff90,"Failed writing playback samples: %s",pcVar5);
  } while( true );
}

Assistant:

int OSSPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t frame_step{mDevice->channelsFromFmt()};
    const ALuint frame_size{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLOUT;

        int pret{poll(&pollitem, 1, 1000)};
        if(pret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed waiting for playback buffer: %s", strerror(errno));
            break;
        }
        else if(pret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        ALubyte *write_ptr{mMixData.data()};
        size_t to_write{mMixData.size()};
        mDevice->renderSamples(write_ptr, static_cast<ALuint>(to_write/frame_size), frame_step);
        while(to_write > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            ssize_t wrote{write(mFd, write_ptr, to_write)};
            if(wrote < 0)
            {
                if(errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
                    continue;
                ERR("write failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed writing playback samples: %s", strerror(errno));
                break;
            }

            to_write -= static_cast<size_t>(wrote);
            write_ptr += wrote;
        }
    }

    return 0;
}